

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall
BackwardPass::InsertTypeTransition
          (BackwardPass *this,Instr *instrInsertBefore,StackSym *objSym,AddPropertyCacheBucket *data
          ,BVSparse<Memory::JitArenaAllocator> *upwardExposedUses)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  undefined4 *puVar4;
  JITType *pJVar5;
  intptr_t iVar6;
  AddrOpnd *src2Opnd;
  JITTypeHandler *oldTypeHandler;
  JITTypeHandler *newTypeHandler;
  StackSym *pSVar7;
  StackSym *auxSlotPtrSym;
  bool needSlotAdjustment;
  PropertyIndex newInlineSlotCapacity;
  PropertyIndex inlineSlotCapacity;
  int newCount;
  int oldCount;
  Instr *adjustTypeInstr;
  AddrOpnd *local_60;
  AddrOpnd *finalTypeOpnd;
  JITTypeHolder finalType;
  AddrOpnd *initialTypeOpnd;
  JITTypeHolder initialType;
  RegOpnd *baseOpnd;
  BVSparse<Memory::JitArenaAllocator> *upwardExposedUses_local;
  AddPropertyCacheBucket *data_local;
  StackSym *objSym_local;
  Instr *instrInsertBefore_local;
  BackwardPass *this_local;
  
  bVar2 = IsPrePass(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1742,"(!this->IsPrePass())","!this->IsPrePass()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  initialType.t = (Type)IR::RegOpnd::New(objSym,TyInt64,this->func);
  IR::Opnd::SetIsJITOptimizedReg((Opnd *)initialType.t,true);
  initialTypeOpnd = (AddrOpnd *)AddPropertyCacheBucket::GetInitialType(data);
  finalType = AddPropertyCacheBucket::GetInitialType(data);
  pJVar5 = JITTypeHolderBase<void>::operator->(&finalType);
  iVar6 = JITType::GetAddr(pJVar5);
  src2Opnd = IR::AddrOpnd::New(iVar6,AddrOpndKindDynamicType,this->func,false,(Var)0x0);
  src2Opnd->m_metadata = initialTypeOpnd;
  finalTypeOpnd = (AddrOpnd *)AddPropertyCacheBucket::GetFinalType(data);
  adjustTypeInstr = (Instr *)AddPropertyCacheBucket::GetFinalType(data);
  pJVar5 = JITTypeHolderBase<void>::operator->((JITTypeHolderBase<void> *)&adjustTypeInstr);
  iVar6 = JITType::GetAddr(pJVar5);
  local_60 = IR::AddrOpnd::New(iVar6,AddrOpndKindDynamicType,this->func,false,(Var)0x0);
  local_60->m_metadata = finalTypeOpnd;
  _newCount = IR::Instr::New(AdjustObjType,&local_60->super_Opnd,(Opnd *)initialType.t,
                             &src2Opnd->super_Opnd,this->func);
  if (upwardExposedUses != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    pJVar5 = JITTypeHolderBase<void>::operator->((JITTypeHolderBase<void> *)&initialTypeOpnd);
    oldTypeHandler = JITType::GetTypeHandler(pJVar5);
    pJVar5 = JITTypeHolderBase<void>::operator->((JITTypeHolderBase<void> *)&finalTypeOpnd);
    newTypeHandler = JITType::GetTypeHandler(pJVar5);
    auxSlotPtrSym._3_1_ =
         JITTypeHandler::NeedSlotAdjustment
                   (oldTypeHandler,newTypeHandler,(int *)&newInlineSlotCapacity,
                    (int *)&stack0xffffffffffffff88,(PropertyIndex *)((long)&auxSlotPtrSym + 6),
                    (PropertyIndex *)((long)&auxSlotPtrSym + 4));
    if ((((bool)auxSlotPtrSym._3_1_) &&
        (pSVar7 = StackSym::GetAuxSlotPtrSym((StackSym *)((initialType.t)->m_data).protoAddr.ptr),
        pSVar7 != (StackSym *)0x0)) &&
       (BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                          (upwardExposedUses,(pSVar7->super_Sym).m_id), BVar3 != '\0')) {
      _newCount->m_opcode = AdjustObjTypeReloadAuxSlotPtr;
    }
  }
  IR::Instr::InsertBefore(instrInsertBefore,_newCount);
  return;
}

Assistant:

void
BackwardPass::InsertTypeTransition(IR::Instr *instrInsertBefore, StackSym *objSym, AddPropertyCacheBucket *data, BVSparse<JitArenaAllocator>* upwardExposedUses)
{
    Assert(!this->IsPrePass());

    IR::RegOpnd *baseOpnd = IR::RegOpnd::New(objSym, TyMachReg, this->func);
    baseOpnd->SetIsJITOptimizedReg(true);

    JITTypeHolder initialType = data->GetInitialType();
    IR::AddrOpnd *initialTypeOpnd =
        IR::AddrOpnd::New(data->GetInitialType()->GetAddr(), IR::AddrOpndKindDynamicType, this->func);
    initialTypeOpnd->m_metadata = initialType.t;

    JITTypeHolder finalType = data->GetFinalType();
    IR::AddrOpnd *finalTypeOpnd =
        IR::AddrOpnd::New(data->GetFinalType()->GetAddr(), IR::AddrOpndKindDynamicType, this->func);
    finalTypeOpnd->m_metadata = finalType.t;

    IR::Instr *adjustTypeInstr =
        IR::Instr::New(Js::OpCode::AdjustObjType, finalTypeOpnd, baseOpnd, initialTypeOpnd, this->func);

    if (upwardExposedUses)
    {
        // If this type change causes a slot adjustment, the aux slot pointer (if any) will be reloaded here, so take it out of upwardExposedUses.
        int oldCount;
        int newCount;
        Js::PropertyIndex inlineSlotCapacity;
        Js::PropertyIndex newInlineSlotCapacity;
        bool needSlotAdjustment =
            JITTypeHandler::NeedSlotAdjustment(initialType->GetTypeHandler(), finalType->GetTypeHandler(), &oldCount, &newCount, &inlineSlotCapacity, &newInlineSlotCapacity);
        if (needSlotAdjustment)
        {
            StackSym *auxSlotPtrSym = baseOpnd->m_sym->GetAuxSlotPtrSym();
            if (auxSlotPtrSym)
            {
                if (upwardExposedUses->Test(auxSlotPtrSym->m_id))
                {
                    adjustTypeInstr->m_opcode = Js::OpCode::AdjustObjTypeReloadAuxSlotPtr;
                }
            }
        }
    }

    instrInsertBefore->InsertBefore(adjustTypeInstr);
}